

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O3

void __thiscall Dice::resetResolvedHand(Dice *this)

{
  mapped_type *pmVar1;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *this_00;
  key_type local_1c;
  
  this_00 = &this->resolvedHand;
  local_1c = Heal;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  *pmVar1 = 0;
  local_1c = Attack;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  *pmVar1 = 0;
  local_1c = Celebrity;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  *pmVar1 = 0;
  local_1c = Destruction;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  *pmVar1 = 0;
  local_1c = Energy;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  *pmVar1 = 0;
  local_1c = Ouch;
  pmVar1 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&local_1c);
  *pmVar1 = 0;
  return;
}

Assistant:

void Dice::resetResolvedHand() {
    resolvedHand[DiceOptions::Heal] = 0;
    resolvedHand[DiceOptions::Attack] = 0;
    resolvedHand[DiceOptions::Celebrity] = 0;
    resolvedHand[DiceOptions::Destruction] = 0;
    resolvedHand[DiceOptions::Energy] = 0;
    resolvedHand[DiceOptions::Ouch] = 0;
}